

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O2

int checkpanic(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  lua_Alloc f;
  lua_State *L_00;
  void *ud;
  Aux b;
  
  pcVar2 = luaL_checklstring(L,1,(size_t *)0x0);
  f = lua_getallocf(L,&ud);
  b.paniccode = luaL_optlstring(L,2,"",(size_t *)0x0);
  b.L = L;
  L_00 = lua_newstate(f,ud);
  if (L_00 == (lua_State *)0x0) {
    lua_pushnil(L);
  }
  else {
    lua_atpanic(L_00,panicback);
    lua_pushlightuserdata(L_00,&b);
    lua_setfield(L_00,-0xf4628,"_jmpbuf");
    iVar1 = _setjmp((__jmp_buf_tag *)&b);
    if (iVar1 == 0) {
      runC(L,L_00,pcVar2);
      pcVar2 = "no errors";
    }
    else {
      pcVar2 = lua_tolstring(L_00,-1,(size_t *)0x0);
    }
    lua_pushstring(L,pcVar2);
    lua_close(L_00);
  }
  return 1;
}

Assistant:

static int checkpanic (lua_State *L) {
  struct Aux b;
  void *ud;
  lua_State *L1;
  const char *code = luaL_checkstring(L, 1);
  lua_Alloc f = lua_getallocf(L, &ud);
  b.paniccode = luaL_optstring(L, 2, "");
  b.L = L;
  L1 = lua_newstate(f, ud);  /* create new state */
  if (L1 == NULL) {  /* error? */
    lua_pushnil(L);
    return 1;
  }
  lua_atpanic(L1, panicback);  /* set its panic function */
  lua_pushlightuserdata(L1, &b);
  lua_setfield(L1, LUA_REGISTRYINDEX, "_jmpbuf");  /* store 'Aux' struct */
  if (setjmp(b.jb) == 0) {  /* set jump buffer */
    runC(L, L1, code);  /* run code unprotected */
    lua_pushliteral(L, "no errors");
  }
  else {  /* error handling */
    /* move error message to original state */
    lua_pushstring(L, lua_tostring(L1, -1));
  }
  lua_close(L1);
  return 1;
}